

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
resizeLike<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,false>>
          (PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *this,
          EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>_> *_other)

{
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false> *other;
  
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)this,2,1);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }